

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ParamAssignmentSyntax * __thiscall slang::parsing::Parser::parseParamValue(Parser *this)

{
  Token openParen;
  Token name_00;
  Token dot_00;
  bool bVar1;
  ExpressionSyntax *expr_00;
  bitmask<slang::parsing::detail::ExpressionOptions> local_c4;
  type local_c0;
  type local_b8;
  undefined8 local_b0;
  Info *local_a8;
  undefined8 local_a0;
  Token local_98;
  Token local_88;
  type *expr;
  type *innerCloseParen;
  type *innerOpenParen;
  tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::ExpressionSyntax_*> local_60;
  undefined1 local_38 [8];
  Token name;
  Token dot;
  Parser *this_local;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
  if (bVar1) {
    join_0x00000010_0x00000000_ = ParserBase::consume(&this->super_ParserBase);
    _local_38 = ParserBase::expect(&this->super_ParserBase,Identifier);
    innerOpenParen = (type *)this;
    ParserBase::
    parseGroupOrSkip<slang::parsing::Parser::parseParamValue()::__0,slang::syntax::ExpressionSyntax*>
              (&local_60,&this->super_ParserBase,OpenParenthesis,CloseParenthesis,
               (anon_class_8_1_8991fb9c *)&innerOpenParen);
    innerCloseParen =
         std::get<0ul,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*>
                   (&local_60);
    expr = (type *)std::
                   get<1ul,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*>
                             (&local_60);
    local_88.info =
         (Info *)std::
                 get<2ul,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*>
                           (&local_60);
    dot_00 = stack0xffffffffffffffd8;
    name_00 = _local_38;
    local_98.info = name.info;
    local_88.kind = dot.kind;
    local_88._2_1_ = dot._2_1_;
    local_88.numFlags.raw = dot.numFlags.raw;
    local_88.rawLen = dot.rawLen;
    local_a0 = local_38;
    local_98.kind = name.kind;
    local_98._2_1_ = name._2_1_;
    local_98.numFlags.raw = name.numFlags.raw;
    local_98.rawLen = name.rawLen;
    local_b0._0_2_ = innerCloseParen->kind;
    local_b0._2_1_ = innerCloseParen->field_0x2;
    local_b0._3_1_ = innerCloseParen->numFlags;
    local_b0._4_4_ = innerCloseParen->rawLen;
    local_a8 = innerCloseParen->info;
    openParen.kind = innerCloseParen->kind;
    openParen._2_1_ = innerCloseParen->field_0x2;
    openParen.numFlags.raw = (innerCloseParen->numFlags).raw;
    openParen.rawLen = innerCloseParen->rawLen;
    openParen.info = innerCloseParen->info;
    local_c0 = *expr;
    local_b8 = expr[1];
    _local_38 = name_00;
    unique0x10000263 = dot_00;
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::namedParamAssignment
                           (&this->factory,dot_00,name_00,openParen,
                            *(ExpressionSyntax **)local_88.info,*(Token *)expr);
  }
  else {
    memset(&local_c4,0,4);
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_c4);
    expr_00 = parseMinTypMaxExpression(this,local_c4);
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::orderedParamAssignment(&this->factory,expr_00);
  }
  return (ParamAssignmentSyntax *)this_local;
}

Assistant:

ParamAssignmentSyntax& Parser::parseParamValue() {
    // check for named arguments
    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        auto name = expect(TokenKind::Identifier);

        auto [innerOpenParen, innerCloseParen,
              expr] = parseGroupOrSkip(TokenKind::OpenParenthesis, TokenKind::CloseParenthesis,
                                       [this]() { return &parseMinTypMaxExpression(); });

        return factory.namedParamAssignment(dot, name, innerOpenParen, expr, innerCloseParen);
    }

    return factory.orderedParamAssignment(parseMinTypMaxExpression());
}